

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O2

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo7(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double m10;
  double m01;
  double local_78;
  double local_70;
  uint64_t local_68;
  double m00;
  uint64_t local_58 [5];
  
  m00 = 0.0;
  m01 = 0.0;
  local_70 = getNormalMoment(this,(uint64_t *)&m00,(uint64_t *)&m01);
  m01 = 0.0;
  m10 = 4.94065645841247e-324;
  m00 = local_70;
  m01 = getNormalMoment(this,(uint64_t *)&m01,(uint64_t *)&m10);
  m10 = 4.94065645841247e-324;
  local_68 = 0;
  m10 = getNormalMoment(this,(uint64_t *)&m10,&local_68);
  local_68 = 2;
  local_58[4] = 0;
  local_78 = getCentralMoment(this,&local_68,local_58 + 4,&m00,&m10,&m01);
  local_58[3] = 0;
  local_58[2] = 2;
  dVar1 = getCentralMoment(this,local_58 + 3,local_58 + 2,&m00,&m10,&m01);
  local_58[1] = 1;
  local_58[0] = 1;
  dVar2 = getCentralMoment(this,local_58 + 1,local_58,&m00,&m10,&m01);
  dVar1 = dVar1 * local_78;
  dVar3 = pow(local_70,4.0);
  return (dVar1 - dVar2 * dVar2) / dVar3;
}

Assistant:

const double
Segment::getHuMomentInvariantNo7()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            (
                this->getCentralMoment(2, 0, m00, m10, m01) *
                this->getCentralMoment(0, 2, m00, m10, m01)
            )
            -
            std::pow(
                this->getCentralMoment(1, 1, m00, m10, m01),
                2
            )
        )
        /
        std::pow(m00, 4)
    );
}